

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert_R8G8B8toB8G8R8(void *sP,s32 sN,void *dP)

{
  ulong uVar1;
  u8 *dB;
  int iVar2;
  u8 *sB;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)sN;
  if (sN < 1) {
    uVar3 = uVar1;
  }
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    *(undefined1 *)((long)dP + uVar1 + 2) = *(undefined1 *)((long)sP + uVar1);
    *(undefined1 *)((long)dP + uVar1 + 1) = *(undefined1 *)((long)sP + uVar1 + 1);
    *(undefined1 *)((long)dP + uVar1) = *(undefined1 *)((long)sP + uVar1 + 2);
    uVar1 = uVar1 + 3;
  }
  return;
}

Assistant:

void CColorConverter::convert_R8G8B8toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[2] = sB[0];
		dB[1] = sB[1];
		dB[0] = sB[2];

		sB += 3;
		dB += 3;
	}
}